

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weighted_digraph_algorithm.h
# Opt level: O1

void __thiscall
my_algorithm::WeightedDigraphSPAcyclic<int,_int>::_dfs
          (WeightedDigraphSPAcyclic<int,_int> *this,Node *vertex)

{
  pointer *pppRVar1;
  iterator __position;
  pointer pWVar2;
  __normal_iterator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*const_*,_std::vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>_>
  _Var3;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  **ppRVar4;
  pointer pWVar5;
  ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar6;
  vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  edges;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *local_40;
  vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  local_38;
  
  local_38.
  super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLVar6 = (vertex->element).value._table._list._header;
  local_40 = vertex;
  while (pLVar6 = pLVar6->_next,
        pLVar6 != (ListNode<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                   *)0x0) {
    std::
    vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
    ::push_back(&local_38,&(pLVar6->element).value);
  }
  __position._M_current =
       (this->_marked_nodes).
       super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_marked_nodes).
      super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>*,std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>*>>
    ::
    _M_realloc_insert<data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>*const&>
              ((vector<data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>*,std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>*>>
                *)&this->_marked_nodes,__position,&local_40);
  }
  else {
    *__position._M_current = local_40;
    pppRVar1 = &(this->_marked_nodes).
                super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppRVar1 = *pppRVar1 + 1;
  }
  pWVar2 = local_38.
           super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_38.
      super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_38.
      super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppRVar4 = &(local_38.
                super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->to;
    do {
      _Var3 = std::
              __find_if<__gnu_cxx::__normal_iterator<data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>*const*,std::vector<data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>*,std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>*>>>,__gnu_cxx::__ops::_Iter_equals_val<data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>*const>>
                        ((this->_marked_nodes).
                         super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->_marked_nodes).
                         super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,ppRVar4);
      if (_Var3._M_current ==
          (this->_marked_nodes).
          super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        _dfs(this,*ppRVar4);
      }
      pWVar5 = (pointer)(ppRVar4 + 2);
      ppRVar4 = ppRVar4 + 3;
    } while (pWVar5 != pWVar2);
  }
  std::
  vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ::insert(&this->_reserve_post_nodes,
           (const_iterator)
           (this->_reserve_post_nodes).
           super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_start,&local_40);
  if (local_38.
      super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void _dfs(Node* vertex) {
            auto edges = vertex->element.value.adjEdges();
            _marked_nodes.push_back(vertex);
            for (auto &edge: edges) {
                if (isInVector<Node*>(_marked_nodes, edge.to)) {
                    continue;
                }
                _dfs(edge.to);
            }
            _reserve_post_nodes.insert(_reserve_post_nodes.begin(), vertex);
        }